

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_compressBlock_lazy2_dictMatchState_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int iVar1;
  ulong uVar2;
  U32 UVar3;
  U32 UVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  BYTE *in_RCX;
  uint *in_RDX;
  long *in_RSI;
  long in_RDI;
  long in_R8;
  bool bVar9;
  BYTE *repEnd2;
  BYTE *repMatch_3;
  U32 repIndex_3;
  U32 current2;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_5;
  int gain2_5;
  size_t ml2_2;
  size_t ofbCandidate_1;
  int gain1_4;
  int gain2_4;
  size_t mlRep_3;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  U32 repIndex_2;
  int gain1_3;
  int gain2_3;
  size_t mlRep_2;
  int gain1_2;
  int gain2_2;
  size_t ml2_1;
  size_t ofbCandidate;
  int gain1_1;
  int gain2_1;
  size_t mlRep_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  U32 repIndex_1;
  int gain1;
  int gain2;
  size_t mlRep;
  size_t step;
  size_t ml2;
  size_t offbaseFound;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  U32 repIndex;
  BYTE *start;
  size_t offBase;
  size_t matchLength;
  U32 maxRep;
  U32 windowLow;
  U32 curr;
  U32 dictAndPrefixLength;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictLowest;
  BYTE *dictBase;
  U32 dictLowestIndex;
  ZSTD_matchState_t *dms;
  int isDxS;
  int isDDS;
  int isDMS;
  U32 offsetSaved2;
  U32 offsetSaved1;
  U32 offset_2;
  U32 offset_1;
  U32 rowLog;
  U32 mls;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  U32 row;
  U32 hash;
  U32 lim;
  U32 maxElemsToPrefetch;
  U32 hashLog;
  BYTE *tagTable;
  U32 *hashTable;
  U32 row_1;
  U32 hash_1;
  U32 lim_1;
  U32 maxElemsToPrefetch_1;
  U32 hashLog_1;
  BYTE *tagTable_1;
  U32 *hashTable_1;
  size_t mlBase_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  size_t mlBase_2;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  U32 in_stack_fffffffffffff7d8;
  U32 in_stack_fffffffffffff7dc;
  undefined4 in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e4;
  undefined4 in_stack_fffffffffffff7e8;
  undefined4 in_stack_fffffffffffff7ec;
  U32 in_stack_fffffffffffff7f0;
  uint in_stack_fffffffffffff7f4;
  BYTE *in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff800;
  U32 in_stack_fffffffffffff804;
  BYTE *in_stack_fffffffffffff808;
  BYTE *in_stack_fffffffffffff810;
  uint in_stack_fffffffffffff818;
  uint in_stack_fffffffffffff81c;
  uint local_7e0;
  ulong local_7d8;
  ulong local_7d0;
  size_t *in_stack_fffffffffffff840;
  BYTE *in_stack_fffffffffffff848;
  int in_stack_fffffffffffff850;
  int in_stack_fffffffffffff854;
  int in_stack_fffffffffffff858;
  int in_stack_fffffffffffff85c;
  int in_stack_fffffffffffff888;
  int in_stack_fffffffffffff88c;
  int in_stack_fffffffffffff890;
  int in_stack_fffffffffffff894;
  int in_stack_fffffffffffff898;
  int in_stack_fffffffffffff89c;
  int in_stack_fffffffffffff8a0;
  int in_stack_fffffffffffff8a4;
  BYTE *local_738;
  void *local_728;
  BYTE *local_688;
  void *local_678;
  BYTE *local_5e8;
  void *local_5d8;
  uint local_5c8;
  uint local_5c0;
  int local_598;
  int local_594;
  uint local_590;
  int local_58c;
  int local_588;
  uint local_584;
  ulong local_528;
  ulong local_508;
  int local_500;
  int local_4fc;
  ulong local_4f8;
  BYTE *local_4f0;
  void *local_4e8;
  uint local_4dc;
  int local_4d8;
  int local_4d4;
  ulong local_4d0;
  int local_4c8;
  int local_4c4;
  size_t local_4c0;
  ulong local_4b8;
  int local_4b0;
  int local_4ac;
  ulong local_4a8;
  BYTE *local_4a0;
  void *local_498;
  uint local_48c;
  int local_488;
  int local_484;
  ulong local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  BYTE *local_460;
  void *local_458;
  uint local_44c;
  BYTE *local_448;
  ulong local_440;
  ulong local_438;
  int local_420;
  uint local_41c;
  BYTE *local_418;
  ulong local_410;
  long local_408;
  uint local_3fc;
  undefined8 *local_3f8;
  int local_3ec;
  undefined4 local_3e8;
  undefined4 local_3e4;
  uint local_3e0;
  uint local_3dc;
  uint local_3d8;
  uint local_3d4;
  int local_3d0;
  int local_3cc;
  ulong local_3c8;
  uint local_3bc;
  long local_3b8;
  BYTE *local_3b0;
  BYTE *local_3a8;
  BYTE *local_3a0;
  BYTE *local_398;
  int local_384;
  int local_380;
  int local_37c;
  uint *local_368;
  long *local_360;
  long local_358;
  int local_34c;
  uint local_348;
  uint local_344;
  uint local_340;
  int local_33c;
  undefined8 local_338;
  undefined8 local_330;
  BYTE *local_328;
  uint local_31c;
  int local_318;
  int local_314;
  long local_310;
  long local_308;
  int local_2fc;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  int local_2ec;
  undefined8 local_2e8;
  undefined8 local_2e0;
  BYTE *local_2d8;
  uint local_2cc;
  int local_2c8;
  int local_2c4;
  long local_2c0;
  long local_2b8;
  undefined8 local_2b0;
  int local_2a8;
  int local_2a4;
  long local_2a0;
  size_t local_298;
  undefined8 local_290;
  int local_288;
  int local_284;
  long local_280;
  size_t local_278;
  int local_270;
  int local_26c;
  undefined8 local_268;
  undefined8 local_260;
  int local_258;
  int local_254;
  undefined8 local_250;
  undefined8 local_248;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  ulong *local_230;
  BYTE *local_228;
  BYTE *local_220;
  long local_218;
  ulong local_210;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  ulong *local_1f8;
  BYTE *local_1f0;
  BYTE *local_1e8;
  long local_1e0;
  size_t local_1d8;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  ulong *local_1c0;
  BYTE *local_1b8;
  BYTE *local_1b0;
  long local_1a8;
  ulong local_1a0;
  ulong local_198;
  BYTE *local_190;
  BYTE *local_188;
  ulong local_180;
  undefined4 local_174;
  BYTE *local_170;
  BYTE *local_168;
  ulong local_160;
  long *local_158;
  ulong local_150;
  BYTE *local_148;
  BYTE *local_140;
  ulong local_138;
  undefined4 local_12c;
  BYTE *local_128;
  BYTE *local_120;
  ulong local_118;
  long *local_110;
  ulong local_108;
  BYTE *local_100;
  BYTE *local_f8;
  ulong local_f0;
  undefined4 local_e4;
  BYTE *local_e0;
  BYTE *local_d8;
  ulong local_d0;
  long *local_c8;
  void *local_c0;
  void *local_b8;
  BYTE *local_b0;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  BYTE *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  BYTE *local_70;
  long local_68;
  undefined4 local_5c;
  long local_58;
  BYTE *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  BYTE *local_30;
  long local_28;
  undefined4 local_1c;
  long local_18;
  BYTE *local_10;
  void *local_8;
  
  local_3a8 = in_RCX + in_R8;
  local_3b0 = local_3a8 + -0x10;
  local_3b8 = *(long *)(in_RDI + 8);
  local_3bc = *(uint *)(in_RDI + 0x18);
  local_3c8 = local_3b8 + (ulong)local_3bc;
  if (*(uint *)(in_RDI + 0x110) < 6) {
    local_584 = *(uint *)(in_RDI + 0x110);
  }
  else {
    local_584 = 6;
  }
  if (local_584 < 4) {
    local_588 = 4;
  }
  else {
    if (*(uint *)(in_RDI + 0x110) < 6) {
      local_58c = *(int *)(in_RDI + 0x110);
    }
    else {
      local_58c = 6;
    }
    local_588 = local_58c;
  }
  if (*(uint *)(in_RDI + 0x10c) < 6) {
    local_590 = *(uint *)(in_RDI + 0x10c);
  }
  else {
    local_590 = 6;
  }
  if (local_590 < 4) {
    local_594 = 4;
  }
  else {
    if (*(uint *)(in_RDI + 0x10c) < 6) {
      local_598 = *(int *)(in_RDI + 0x10c);
    }
    else {
      local_598 = 6;
    }
    local_594 = local_598;
  }
  local_3d4 = *in_RDX;
  local_3d8 = in_RDX[1];
  local_3f8 = *(undefined8 **)(in_RDI + 0xf8);
  local_3fc = *(uint *)(local_3f8 + 3);
  local_408 = local_3f8[1];
  local_410 = local_408 + (ulong)local_3fc;
  local_418 = (BYTE *)*local_3f8;
  local_41c = local_3bc - ((int)local_418 - (int)local_408);
  local_420 = ((int)in_RCX - (int)local_3c8) + ((int)local_418 - (int)local_410);
  local_398 = in_RCX + (int)(uint)(local_420 == 0);
  local_37c = 2;
  local_380 = 2;
  local_384 = 2;
  local_3cc = local_588;
  local_3d0 = local_594;
  local_3dc = 0;
  local_3e0 = 0;
  local_3e4 = 1;
  local_3e8 = 0;
  local_3ec = 1;
  *(undefined4 *)(in_RDI + 300) = 0;
  local_31c = *(uint *)(in_RDI + 0x2c);
  local_314 = local_594;
  local_318 = local_588;
  local_330 = *(undefined8 *)(in_RDI + 0x70);
  local_338 = *(undefined8 *)(in_RDI + 0x38);
  local_33c = *(int *)(in_RDI + 0x34);
  if (local_3b0 < (BYTE *)(local_3b8 + (ulong)local_31c)) {
    local_5c0 = 0;
  }
  else {
    local_5c0 = ((int)local_3b0 - ((int)local_3b8 + local_31c)) + 1;
  }
  local_340 = local_5c0;
  if (local_5c0 < 9) {
    local_5c8 = local_5c0;
  }
  else {
    local_5c8 = 8;
  }
  local_344 = local_31c + local_5c8;
  local_7e0 = in_stack_fffffffffffff818;
  local_3a0 = in_RCX;
  local_368 = in_RDX;
  local_360 = in_RSI;
  local_358 = in_RDI;
  local_328 = local_3b0;
  local_310 = local_3b8;
  local_308 = in_RDI;
  for (; local_31c < local_344; local_31c = local_31c + 1) {
    local_280 = local_310 + (ulong)local_31c;
    local_284 = local_33c + 8;
    local_290 = *(undefined8 *)(local_308 + 0x60);
    local_288 = local_318;
    switch(local_318) {
    default:
      local_278 = ZSTD_hash4PtrS((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                  in_stack_fffffffffffff7e0),
                                 in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8);
      break;
    case 5:
      local_278 = ZSTD_hash5PtrS((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                  in_stack_fffffffffffff7e0),
                                 in_stack_fffffffffffff7dc,0x911cf5);
      break;
    case 6:
      local_278 = ZSTD_hash6PtrS((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                  in_stack_fffffffffffff7e0),
                                 in_stack_fffffffffffff7dc,0x911d1b);
      break;
    case 7:
      local_278 = ZSTD_hash7PtrS((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                  in_stack_fffffffffffff7e0),
                                 in_stack_fffffffffffff7dc,0x911d41);
      break;
    case 8:
      local_278 = ZSTD_hash8PtrS((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                  in_stack_fffffffffffff7e0),
                                 in_stack_fffffffffffff7dc,0x911d67);
    }
    local_348 = (uint)local_278;
    local_34c = (local_348 >> 8) << ((byte)local_314 & 0x1f);
    local_248 = local_330;
    local_250 = local_338;
    local_258 = local_314;
    *(uint *)(local_308 + 0x40 + (ulong)(local_31c & 7) * 4) = local_348;
    local_254 = local_34c;
  }
  do {
    while( true ) {
      if (local_3b0 <= local_398) {
        if ((local_3dc != 0) && (local_3d4 != 0)) {
          local_3e0 = local_3dc;
        }
        if (local_3d4 != 0) {
          local_3dc = local_3d4;
        }
        *local_368 = local_3dc;
        if (local_3d8 != 0) {
          local_3e0 = local_3d8;
        }
        local_368[1] = local_3e0;
        return (long)local_3a8 - (long)local_3a0;
      }
      local_438 = 0;
      local_440 = 1;
      local_448 = local_398 + 1;
      if (local_3ec == 0) break;
      local_44c = (((int)local_398 - (int)local_3b8) + 1) - local_3d4;
      if (((local_384 == 2) || (local_384 == 3)) && (local_44c < local_3bc)) {
        local_5d8 = (void *)(local_408 + (ulong)(local_44c - local_41c));
      }
      else {
        local_5d8 = (void *)(local_3b8 + (ulong)local_44c);
      }
      local_458 = local_5d8;
      if ((local_3bc - 1) - local_44c < 3) break;
      UVar3 = MEM_read32(local_5d8);
      UVar4 = MEM_read32(local_398 + 1);
      if (UVar3 != UVar4) break;
      if (local_44c < local_3bc) {
        local_5e8 = local_418;
      }
      else {
        local_5e8 = local_3a8;
      }
      local_460 = local_5e8;
      sVar7 = ZSTD_count_2segments
                        ((BYTE *)CONCAT44(in_stack_fffffffffffff81c,local_7e0),
                         in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                         (BYTE *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                         in_stack_fffffffffffff7f8);
      local_438 = sVar7 + 4;
      if (local_380 != 0) break;
LAB_009161eb:
      local_d0 = (long)local_448 - (long)local_3a0;
      local_c8 = local_360;
      local_d8 = local_3a0;
      local_e0 = local_3a8;
      local_e4 = (undefined4)local_440;
      local_f0 = local_438;
      local_f8 = local_3a8 + -0x20;
      local_100 = local_3a0 + local_d0;
      if (local_f8 < local_100) {
        ZSTD_safecopyLiterals
                  ((BYTE *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                   (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                   (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                   (BYTE *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
      }
      else {
        ZSTD_copy16((void *)local_360[3],local_3a0);
        if (0x10 < local_d0) {
          local_b8 = (void *)(local_c8[3] + 0x10);
          local_b0 = local_d8 + 0x10;
          local_98 = local_d0 - 0x10;
          local_9c = 0;
          local_a8 = (long)local_b8 - (long)local_b0;
          local_c0 = (void *)((long)local_b8 + local_98);
          local_90 = local_b0;
          local_88 = local_b8;
          ZSTD_copy16(local_b8,local_b0);
          if (0x10 < local_98) {
            local_b8 = (void *)((long)local_b8 + 0x10);
            local_b0 = local_b0 + 0x10;
            do {
              ZSTD_copy16(local_b8,local_b0);
              local_b8 = (void *)((long)local_b8 + 0x10);
              local_b0 = local_b0 + 0x10;
              ZSTD_copy16(local_b8,local_b0);
              local_b8 = (void *)((long)local_b8 + 0x10);
              local_b0 = local_b0 + 0x10;
            } while (local_b8 < local_c0);
          }
        }
      }
      local_c8[3] = local_d0 + local_c8[3];
      if (0xffff < local_d0) {
        *(undefined4 *)(local_c8 + 9) = 1;
        *(int *)((long)local_c8 + 0x4c) = (int)(local_c8[1] - *local_c8 >> 3);
      }
      *(short *)(local_c8[1] + 4) = (short)local_d0;
      *(undefined4 *)local_c8[1] = local_e4;
      local_108 = local_f0 - 3;
      if (0xffff < local_108) {
        *(undefined4 *)(local_c8 + 9) = 2;
        *(int *)((long)local_c8 + 0x4c) = (int)(local_c8[1] - *local_c8 >> 3);
      }
      *(short *)(local_c8[1] + 6) = (short)local_108;
      local_c8[1] = local_c8[1] + 8;
      local_3a0 = local_448 + local_438;
      local_398 = local_3a0;
      if (*(int *)(local_358 + 300) != 0) {
        if (local_37c == 2) {
          in_stack_fffffffffffff81c = *(uint *)(local_358 + 0x2c);
          local_2b8 = local_358;
          local_2c0 = local_3b8;
          local_2c4 = local_3d0;
          local_2c8 = local_3cc;
          local_2d8 = local_3b0;
          local_2e0 = *(undefined8 *)(local_358 + 0x70);
          local_2e8 = *(undefined8 *)(local_358 + 0x38);
          local_2ec = *(int *)(local_358 + 0x34);
          if (local_3b0 < (BYTE *)(local_3b8 + (ulong)in_stack_fffffffffffff81c)) {
            local_7e0 = 0;
          }
          else {
            local_7e0 = ((int)local_3b0 - ((int)local_3b8 + in_stack_fffffffffffff81c)) + 1;
          }
          local_2f0 = local_7e0;
          if (8 < local_7e0) {
            local_7e0 = 8;
          }
          local_2f4 = in_stack_fffffffffffff81c + local_7e0;
          for (local_2cc = in_stack_fffffffffffff81c; local_2cc < local_2f4;
              local_2cc = local_2cc + 1) {
            local_2a0 = local_2c0 + (ulong)local_2cc;
            local_2a4 = local_2ec + 8;
            local_2b0 = *(undefined8 *)(local_2b8 + 0x60);
            local_2a8 = local_2c8;
            in_stack_fffffffffffff810 = (BYTE *)(ulong)(local_2c8 - 4);
            switch(in_stack_fffffffffffff810) {
            default:
              local_298 = ZSTD_hash4PtrS((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                          in_stack_fffffffffffff7e0),
                                         in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8);
              break;
            case (BYTE *)0x1:
              local_298 = ZSTD_hash5PtrS((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                          in_stack_fffffffffffff7e0),
                                         in_stack_fffffffffffff7dc,0x916849);
              break;
            case (BYTE *)0x2:
              local_298 = ZSTD_hash6PtrS((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                          in_stack_fffffffffffff7e0),
                                         in_stack_fffffffffffff7dc,0x91686f);
              break;
            case (BYTE *)0x3:
              local_298 = ZSTD_hash7PtrS((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                          in_stack_fffffffffffff7e0),
                                         in_stack_fffffffffffff7dc,0x916895);
              break;
            case (BYTE *)0x4:
              local_298 = ZSTD_hash8PtrS((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                          in_stack_fffffffffffff7e0),
                                         in_stack_fffffffffffff7dc,0x9168bb);
            }
            local_2f8 = (uint)local_298;
            local_2fc = (local_2f8 >> 8) << ((byte)local_2c4 & 0x1f);
            local_260 = local_2e0;
            local_268 = local_2e8;
            local_270 = local_2c4;
            *(uint *)(local_2b8 + 0x40 + (ulong)(local_2cc & 7) * 4) = local_2f8;
            local_26c = local_2fc;
          }
        }
        *(undefined4 *)(local_358 + 300) = 0;
      }
      if (local_3ec != 0) {
        while (local_398 <= local_3b0) {
          uVar6 = ((int)local_398 - (int)local_3b8) - local_3d8;
          if (uVar6 < local_3bc) {
            in_stack_fffffffffffff808 = (BYTE *)((local_408 - (ulong)local_41c) + (ulong)uVar6);
          }
          else {
            in_stack_fffffffffffff808 = (BYTE *)(local_3b8 + (ulong)uVar6);
          }
          if ((local_3bc - 1) - uVar6 < 3) break;
          in_stack_fffffffffffff804 = MEM_read32(in_stack_fffffffffffff808);
          UVar3 = MEM_read32(local_398);
          if (in_stack_fffffffffffff804 != UVar3) break;
          in_stack_fffffffffffff7f8 = local_3a8;
          if (uVar6 < local_3bc) {
            in_stack_fffffffffffff7f8 = local_418;
          }
          sVar7 = ZSTD_count_2segments
                            ((BYTE *)CONCAT44(in_stack_fffffffffffff81c,local_7e0),
                             in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                             (BYTE *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                             in_stack_fffffffffffff7f8);
          uVar6 = local_3d8;
          local_438 = sVar7 + 4;
          local_440 = (ulong)local_3d8;
          local_3d8 = local_3d4;
          local_3d4 = uVar6;
          local_158 = local_360;
          local_160 = 0;
          local_168 = local_3a0;
          local_170 = local_3a8;
          local_174 = 1;
          local_188 = local_3a8 + -0x20;
          local_190 = local_3a0;
          local_180 = local_438;
          if (local_188 < local_3a0) {
            ZSTD_safecopyLiterals
                      ((BYTE *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                       (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                       (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                       (BYTE *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
          }
          else {
            ZSTD_copy16((void *)local_360[3],local_3a0);
            if (0x10 < local_160) {
              local_38 = (void *)(local_158[3] + 0x10);
              local_30 = local_168 + 0x10;
              local_18 = local_160 - 0x10;
              local_1c = 0;
              local_28 = (long)local_38 - (long)local_30;
              local_40 = (void *)((long)local_38 + local_18);
              local_10 = local_30;
              local_8 = local_38;
              ZSTD_copy16(local_38,local_30);
              if (0x10 < local_18) {
                local_38 = (void *)((long)local_38 + 0x10);
                local_30 = local_30 + 0x10;
                do {
                  ZSTD_copy16(local_38,local_30);
                  local_38 = (void *)((long)local_38 + 0x10);
                  local_30 = local_30 + 0x10;
                  ZSTD_copy16(local_38,local_30);
                  local_38 = (void *)((long)local_38 + 0x10);
                  local_30 = local_30 + 0x10;
                } while (local_38 < local_40);
              }
            }
          }
          local_158[3] = local_160 + local_158[3];
          if (0xffff < local_160) {
            *(undefined4 *)(local_158 + 9) = 1;
            *(int *)((long)local_158 + 0x4c) = (int)(local_158[1] - *local_158 >> 3);
          }
          *(short *)(local_158[1] + 4) = (short)local_160;
          *(undefined4 *)local_158[1] = local_174;
          local_198 = local_180 - 3;
          if (0xffff < local_198) {
            *(undefined4 *)(local_158 + 9) = 2;
            *(int *)((long)local_158 + 0x4c) = (int)(local_158[1] - *local_158 >> 3);
          }
          *(short *)(local_158[1] + 6) = (short)local_198;
          local_158[1] = local_158[1] + 8;
          local_3a0 = local_398 + local_438;
          local_398 = local_3a0;
        }
      }
      if (local_384 == 0) {
        while( true ) {
          in_stack_fffffffffffff7f4 = in_stack_fffffffffffff7f4 & 0xffffff;
          if (local_398 <= local_3b0 && local_3d8 != 0) {
            in_stack_fffffffffffff7f0 = MEM_read32(local_398);
            UVar3 = MEM_read32(local_398 + -(ulong)local_3d8);
            in_stack_fffffffffffff7f4 =
                 CONCAT13(in_stack_fffffffffffff7f0 == UVar3,(int3)in_stack_fffffffffffff7f4);
          }
          if ((char)(in_stack_fffffffffffff7f4 >> 0x18) == '\0') break;
          sVar7 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffff81c,local_7e0),
                             in_stack_fffffffffffff810,in_stack_fffffffffffff808);
          uVar6 = local_3d8;
          local_438 = sVar7 + 4;
          local_440 = (ulong)local_3d8;
          local_3d8 = local_3d4;
          local_3d4 = uVar6;
          local_110 = local_360;
          local_118 = 0;
          local_120 = local_3a0;
          local_128 = local_3a8;
          local_12c = 1;
          local_140 = local_3a8 + -0x20;
          local_148 = local_3a0;
          local_138 = local_438;
          if (local_140 < local_3a0) {
            ZSTD_safecopyLiterals
                      ((BYTE *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                       (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                       (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                       (BYTE *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
          }
          else {
            ZSTD_copy16((void *)local_360[3],local_3a0);
            if (0x10 < local_118) {
              local_78 = (void *)(local_110[3] + 0x10);
              local_70 = local_120 + 0x10;
              local_58 = local_118 - 0x10;
              local_5c = 0;
              local_68 = (long)local_78 - (long)local_70;
              local_80 = (void *)((long)local_78 + local_58);
              local_50 = local_70;
              local_48 = local_78;
              ZSTD_copy16(local_78,local_70);
              if (0x10 < local_58) {
                local_78 = (void *)((long)local_78 + 0x10);
                local_70 = local_70 + 0x10;
                do {
                  ZSTD_copy16(local_78,local_70);
                  local_78 = (void *)((long)local_78 + 0x10);
                  local_70 = local_70 + 0x10;
                  ZSTD_copy16(local_78,local_70);
                  local_78 = (void *)((long)local_78 + 0x10);
                  local_70 = local_70 + 0x10;
                } while (local_78 < local_80);
              }
            }
          }
          local_110[3] = local_118 + local_110[3];
          if (0xffff < local_118) {
            *(undefined4 *)(local_110 + 9) = 1;
            *(int *)((long)local_110 + 0x4c) = (int)(local_110[1] - *local_110 >> 3);
          }
          *(short *)(local_110[1] + 4) = (short)local_118;
          *(undefined4 *)local_110[1] = local_12c;
          local_150 = local_138 - 3;
          if (0xffff < local_150) {
            *(undefined4 *)(local_110 + 9) = 2;
            *(int *)((long)local_110 + 0x4c) = (int)(local_110[1] - *local_110 >> 3);
          }
          *(short *)(local_110[1] + 6) = (short)local_150;
          local_110[1] = local_110[1] + 8;
          local_3a0 = local_398 + local_438;
          local_398 = local_3a0;
        }
      }
    }
    if (local_384 == 0) {
      bVar9 = local_3d4 != 0;
      UVar3 = MEM_read32(local_398 + (1 - (ulong)local_3d4));
      UVar4 = MEM_read32(local_398 + 1);
      if (bVar9 && UVar3 == UVar4) {
        sVar7 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffff81c,local_7e0),
                           in_stack_fffffffffffff810,in_stack_fffffffffffff808);
        local_438 = sVar7 + 4;
        if (local_380 == 0) goto LAB_009161eb;
      }
    }
    local_468 = 999999999;
    local_1a8 = local_358;
    local_1b0 = local_398;
    local_1b8 = local_3a8;
    local_1c0 = &local_468;
    local_1c4 = local_3cc;
    local_1c8 = local_3d0;
    local_1cc = local_37c;
    local_1d0 = local_384;
    if (local_384 == 0) {
      if (local_37c == 0) {
        if (local_3cc == 4) {
          local_1a0 = ZSTD_HcFindBestMatch_noDict_4
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                  in_stack_fffffffffffff850),
                                 in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        }
        else if (local_3cc == 5) {
          local_1a0 = ZSTD_HcFindBestMatch_noDict_5
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                  in_stack_fffffffffffff850),
                                 in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        }
        else {
          if (local_3cc != 6) goto LAB_00912617;
          local_1a0 = ZSTD_HcFindBestMatch_noDict_6
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                  in_stack_fffffffffffff850),
                                 in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        }
      }
      else if (local_37c == 1) {
        if (local_3cc == 4) {
          local_1a0 = ZSTD_BtFindBestMatch_noDict_4
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                  in_stack_fffffffffffff7e8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                  in_stack_fffffffffffff7e0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
        }
        else if (local_3cc == 5) {
          local_1a0 = ZSTD_BtFindBestMatch_noDict_5
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                  in_stack_fffffffffffff7e8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                  in_stack_fffffffffffff7e0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
        }
        else {
          if (local_3cc != 6) goto LAB_00912617;
          local_1a0 = ZSTD_BtFindBestMatch_noDict_6
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                  in_stack_fffffffffffff7e8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                  in_stack_fffffffffffff7e0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
        }
      }
      else if (local_3cc == 4) {
        if (local_3d0 == 4) {
          local_1a0 = ZSTD_RowFindBestMatch_noDict_4_4
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                  in_stack_fffffffffffff898),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                  in_stack_fffffffffffff890),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        }
        else if (local_3d0 == 5) {
          local_1a0 = ZSTD_RowFindBestMatch_noDict_4_5
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                  in_stack_fffffffffffff898),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                  in_stack_fffffffffffff890),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        }
        else {
          local_1a0 = ZSTD_RowFindBestMatch_noDict_4_6
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                  in_stack_fffffffffffff898),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                  in_stack_fffffffffffff890),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        }
      }
      else if (local_3cc == 5) {
        if (local_3d0 == 4) {
          local_1a0 = ZSTD_RowFindBestMatch_noDict_5_4
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                  in_stack_fffffffffffff898),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                  in_stack_fffffffffffff890),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        }
        else if (local_3d0 == 5) {
          local_1a0 = ZSTD_RowFindBestMatch_noDict_5_5
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                  in_stack_fffffffffffff898),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                  in_stack_fffffffffffff890),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        }
        else {
          local_1a0 = ZSTD_RowFindBestMatch_noDict_5_6
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                  in_stack_fffffffffffff898),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                  in_stack_fffffffffffff890),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        }
      }
      else {
        if (local_3cc != 6) goto LAB_00912617;
        if (local_3d0 == 4) {
          local_1a0 = ZSTD_RowFindBestMatch_noDict_6_4
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                  in_stack_fffffffffffff898),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                  in_stack_fffffffffffff890),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        }
        else if (local_3d0 == 5) {
          local_1a0 = ZSTD_RowFindBestMatch_noDict_6_5
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                  in_stack_fffffffffffff898),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                  in_stack_fffffffffffff890),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        }
        else {
          local_1a0 = ZSTD_RowFindBestMatch_noDict_6_6
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                  in_stack_fffffffffffff898),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                  in_stack_fffffffffffff890),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        }
      }
    }
    else {
LAB_00912617:
      if (local_384 == 1) {
        if (local_37c == 0) {
          if (local_3cc == 4) {
            local_1a0 = ZSTD_HcFindBestMatch_extDict_4
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                    in_stack_fffffffffffff850),
                                   in_stack_fffffffffffff848,in_stack_fffffffffffff840);
          }
          else if (local_3cc == 5) {
            local_1a0 = ZSTD_HcFindBestMatch_extDict_5
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                    in_stack_fffffffffffff850),
                                   in_stack_fffffffffffff848,in_stack_fffffffffffff840);
          }
          else {
            if (local_3cc != 6) goto LAB_00912a5d;
            local_1a0 = ZSTD_HcFindBestMatch_extDict_6
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                    in_stack_fffffffffffff850),
                                   in_stack_fffffffffffff848,in_stack_fffffffffffff840);
          }
        }
        else if (local_37c == 1) {
          if (local_3cc == 4) {
            local_1a0 = ZSTD_BtFindBestMatch_extDict_4
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                    in_stack_fffffffffffff7e8),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                    in_stack_fffffffffffff7e0),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
          }
          else if (local_3cc == 5) {
            local_1a0 = ZSTD_BtFindBestMatch_extDict_5
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                    in_stack_fffffffffffff7e8),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                    in_stack_fffffffffffff7e0),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
          }
          else {
            if (local_3cc != 6) goto LAB_00912a5d;
            local_1a0 = ZSTD_BtFindBestMatch_extDict_6
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                    in_stack_fffffffffffff7e8),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                    in_stack_fffffffffffff7e0),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
          }
        }
        else if (local_3cc == 4) {
          if (local_3d0 == 4) {
            local_1a0 = ZSTD_RowFindBestMatch_extDict_4_4
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                    in_stack_fffffffffffff898),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                    in_stack_fffffffffffff890),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          }
          else if (local_3d0 == 5) {
            local_1a0 = ZSTD_RowFindBestMatch_extDict_4_5
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                    in_stack_fffffffffffff898),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                    in_stack_fffffffffffff890),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          }
          else {
            local_1a0 = ZSTD_RowFindBestMatch_extDict_4_6
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                    in_stack_fffffffffffff898),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                    in_stack_fffffffffffff890),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          }
        }
        else if (local_3cc == 5) {
          if (local_3d0 == 4) {
            local_1a0 = ZSTD_RowFindBestMatch_extDict_5_4
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                    in_stack_fffffffffffff898),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                    in_stack_fffffffffffff890),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          }
          else if (local_3d0 == 5) {
            local_1a0 = ZSTD_RowFindBestMatch_extDict_5_5
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                    in_stack_fffffffffffff898),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                    in_stack_fffffffffffff890),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          }
          else {
            local_1a0 = ZSTD_RowFindBestMatch_extDict_5_6
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                    in_stack_fffffffffffff898),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                    in_stack_fffffffffffff890),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          }
        }
        else {
          if (local_3cc != 6) goto LAB_00912a5d;
          if (local_3d0 == 4) {
            local_1a0 = ZSTD_RowFindBestMatch_extDict_6_4
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                    in_stack_fffffffffffff898),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                    in_stack_fffffffffffff890),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          }
          else if (local_3d0 == 5) {
            local_1a0 = ZSTD_RowFindBestMatch_extDict_6_5
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                    in_stack_fffffffffffff898),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                    in_stack_fffffffffffff890),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          }
          else {
            local_1a0 = ZSTD_RowFindBestMatch_extDict_6_6
                                  ((ZSTD_matchState_t *)
                                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                    in_stack_fffffffffffff898),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                    in_stack_fffffffffffff890),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          }
        }
      }
      else {
LAB_00912a5d:
        if (local_384 == 2) {
          if (local_37c == 0) {
            if (local_3cc == 4) {
              local_1a0 = ZSTD_HcFindBestMatch_dictMatchState_4
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                      in_stack_fffffffffffff850),
                                     in_stack_fffffffffffff848,in_stack_fffffffffffff840);
            }
            else if (local_3cc == 5) {
              local_1a0 = ZSTD_HcFindBestMatch_dictMatchState_5
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                      in_stack_fffffffffffff850),
                                     in_stack_fffffffffffff848,in_stack_fffffffffffff840);
            }
            else {
              if (local_3cc != 6) goto LAB_00912ea3;
              local_1a0 = ZSTD_HcFindBestMatch_dictMatchState_6
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                      in_stack_fffffffffffff850),
                                     in_stack_fffffffffffff848,in_stack_fffffffffffff840);
            }
          }
          else if (local_37c == 1) {
            if (local_3cc == 4) {
              local_1a0 = ZSTD_BtFindBestMatch_dictMatchState_4
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                      in_stack_fffffffffffff7e8),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                      in_stack_fffffffffffff7e0),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
            }
            else if (local_3cc == 5) {
              local_1a0 = ZSTD_BtFindBestMatch_dictMatchState_5
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                      in_stack_fffffffffffff7e8),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                      in_stack_fffffffffffff7e0),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
            }
            else {
              if (local_3cc != 6) goto LAB_00912ea3;
              local_1a0 = ZSTD_BtFindBestMatch_dictMatchState_6
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                      in_stack_fffffffffffff7e8),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                      in_stack_fffffffffffff7e0),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
            }
          }
          else if (local_3cc == 4) {
            if (local_3d0 == 4) {
              local_1a0 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                      in_stack_fffffffffffff898),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                      in_stack_fffffffffffff890),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
            }
            else if (local_3d0 == 5) {
              local_1a0 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                      in_stack_fffffffffffff898),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                      in_stack_fffffffffffff890),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
            }
            else {
              local_1a0 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                      in_stack_fffffffffffff898),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                      in_stack_fffffffffffff890),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
            }
          }
          else if (local_3cc == 5) {
            if (local_3d0 == 4) {
              local_1a0 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                      in_stack_fffffffffffff898),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                      in_stack_fffffffffffff890),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
            }
            else if (local_3d0 == 5) {
              local_1a0 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                      in_stack_fffffffffffff898),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                      in_stack_fffffffffffff890),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
            }
            else {
              local_1a0 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                      in_stack_fffffffffffff898),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                      in_stack_fffffffffffff890),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
            }
          }
          else {
            if (local_3cc != 6) goto LAB_00912ea3;
            if (local_3d0 == 4) {
              local_1a0 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                      in_stack_fffffffffffff898),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                      in_stack_fffffffffffff890),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
            }
            else if (local_3d0 == 5) {
              local_1a0 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                      in_stack_fffffffffffff898),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                      in_stack_fffffffffffff890),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
            }
            else {
              local_1a0 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                                    ((ZSTD_matchState_t *)
                                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                      in_stack_fffffffffffff898),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                      in_stack_fffffffffffff890),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
            }
          }
        }
        else {
LAB_00912ea3:
          if (local_384 == 3) {
            if (local_37c == 0) {
              if (local_3cc == 4) {
                local_1a0 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                         in_stack_fffffffffffff850),
                                       in_stack_fffffffffffff848,in_stack_fffffffffffff840);
              }
              else if (local_3cc == 5) {
                local_1a0 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                         in_stack_fffffffffffff850),
                                       in_stack_fffffffffffff848,in_stack_fffffffffffff840);
              }
              else if (local_3cc == 6) {
                local_1a0 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                         in_stack_fffffffffffff850),
                                       in_stack_fffffffffffff848,in_stack_fffffffffffff840);
              }
            }
            else if (local_37c == 1) {
              if (local_3cc == 4) {
                local_1a0 = ZSTD_BtFindBestMatch_dedicatedDictSearch_4
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                         in_stack_fffffffffffff7e8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                        in_stack_fffffffffffff7e0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8)
                                      );
              }
              else if (local_3cc == 5) {
                local_1a0 = ZSTD_BtFindBestMatch_dedicatedDictSearch_5
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                         in_stack_fffffffffffff7e8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                        in_stack_fffffffffffff7e0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8)
                                      );
              }
              else if (local_3cc == 6) {
                local_1a0 = ZSTD_BtFindBestMatch_dedicatedDictSearch_6
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                         in_stack_fffffffffffff7e8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                        in_stack_fffffffffffff7e0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8)
                                      );
              }
            }
            else if (local_3cc == 4) {
              if (local_3d0 == 4) {
                local_1a0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
              else if (local_3d0 == 5) {
                local_1a0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
              else {
                local_1a0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
            }
            else if (local_3cc == 5) {
              if (local_3d0 == 4) {
                local_1a0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
              else if (local_3d0 == 5) {
                local_1a0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
              else {
                local_1a0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
            }
            else if (local_3cc == 6) {
              if (local_3d0 == 4) {
                local_1a0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
              else if (local_3d0 == 5) {
                local_1a0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
              else {
                local_1a0 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
            }
          }
        }
      }
    }
    local_470 = local_1a0;
    if (local_438 < local_1a0) {
      local_438 = local_1a0;
      local_448 = local_398;
      local_440 = local_468;
    }
    if (3 < local_438) {
      if (local_380 != 0) {
        while (local_398 < local_3b0) {
          local_398 = local_398 + 1;
          if ((local_384 == 0) && (local_440 != 0)) {
            bVar9 = local_3d4 != 0;
            UVar3 = MEM_read32(local_398);
            UVar4 = MEM_read32(local_398 + -(ulong)local_3d4);
            if (bVar9 && UVar3 == UVar4) {
              sVar7 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffff81c,local_7e0),
                                 in_stack_fffffffffffff810,in_stack_fffffffffffff808);
              local_480 = sVar7 + 4;
              local_484 = (int)local_480 * 3;
              iVar1 = (int)local_438;
              uVar6 = ZSTD_highbit32(0);
              local_488 = (iVar1 * 3 - uVar6) + 1;
              if ((3 < local_480) && (local_488 < local_484)) {
                local_438 = local_480;
                local_440 = 1;
                local_448 = local_398;
              }
            }
          }
          if (local_3ec != 0) {
            local_48c = ((int)local_398 - (int)local_3b8) - local_3d4;
            if (local_48c < local_3bc) {
              local_678 = (void *)(local_408 + (ulong)(local_48c - local_41c));
            }
            else {
              local_678 = (void *)(local_3b8 + (ulong)local_48c);
            }
            local_498 = local_678;
            if (2 < (local_3bc - 1) - local_48c) {
              UVar3 = MEM_read32(local_678);
              UVar4 = MEM_read32(local_398);
              if (UVar3 == UVar4) {
                if (local_48c < local_3bc) {
                  local_688 = local_418;
                }
                else {
                  local_688 = local_3a8;
                }
                local_4a0 = local_688;
                sVar7 = ZSTD_count_2segments
                                  ((BYTE *)CONCAT44(in_stack_fffffffffffff81c,local_7e0),
                                   in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff804,
                                                    in_stack_fffffffffffff800),
                                   in_stack_fffffffffffff7f8);
                local_4a8 = sVar7 + 4;
                local_4ac = (int)local_4a8 * 3;
                iVar1 = (int)local_438;
                uVar6 = ZSTD_highbit32(0);
                local_4b0 = (iVar1 * 3 - uVar6) + 1;
                if ((3 < local_4a8) && (local_4b0 < local_4ac)) {
                  local_438 = local_4a8;
                  local_440 = 1;
                  local_448 = local_398;
                }
              }
            }
          }
          local_4b8 = 999999999;
          local_1e0 = local_358;
          local_1e8 = local_398;
          local_1f0 = local_3a8;
          local_1f8 = &local_4b8;
          local_1fc = local_3cc;
          local_200 = local_3d0;
          local_204 = local_37c;
          local_208 = local_384;
          if (local_384 == 0) {
            if (local_37c == 0) {
              if (local_3cc == 4) {
                local_1d8 = ZSTD_HcFindBestMatch_noDict_4
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                         in_stack_fffffffffffff850),
                                       in_stack_fffffffffffff848,in_stack_fffffffffffff840);
              }
              else if (local_3cc == 5) {
                local_1d8 = ZSTD_HcFindBestMatch_noDict_5
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                         in_stack_fffffffffffff850),
                                       in_stack_fffffffffffff848,in_stack_fffffffffffff840);
              }
              else {
                if (local_3cc != 6) goto LAB_00913bf3;
                local_1d8 = ZSTD_HcFindBestMatch_noDict_6
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                         in_stack_fffffffffffff850),
                                       in_stack_fffffffffffff848,in_stack_fffffffffffff840);
              }
            }
            else if (local_37c == 1) {
              if (local_3cc == 4) {
                local_1d8 = ZSTD_BtFindBestMatch_noDict_4
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                         in_stack_fffffffffffff7e8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                        in_stack_fffffffffffff7e0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8)
                                      );
              }
              else if (local_3cc == 5) {
                local_1d8 = ZSTD_BtFindBestMatch_noDict_5
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                         in_stack_fffffffffffff7e8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                        in_stack_fffffffffffff7e0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8)
                                      );
              }
              else {
                if (local_3cc != 6) goto LAB_00913bf3;
                local_1d8 = ZSTD_BtFindBestMatch_noDict_6
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                         in_stack_fffffffffffff7e8),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                        in_stack_fffffffffffff7e0),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8)
                                      );
              }
            }
            else if (local_3cc == 4) {
              if (local_3d0 == 4) {
                local_1d8 = ZSTD_RowFindBestMatch_noDict_4_4
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
              else if (local_3d0 == 5) {
                local_1d8 = ZSTD_RowFindBestMatch_noDict_4_5
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
              else {
                local_1d8 = ZSTD_RowFindBestMatch_noDict_4_6
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
            }
            else if (local_3cc == 5) {
              if (local_3d0 == 4) {
                local_1d8 = ZSTD_RowFindBestMatch_noDict_5_4
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
              else if (local_3d0 == 5) {
                local_1d8 = ZSTD_RowFindBestMatch_noDict_5_5
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
              else {
                local_1d8 = ZSTD_RowFindBestMatch_noDict_5_6
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
            }
            else {
              if (local_3cc != 6) goto LAB_00913bf3;
              if (local_3d0 == 4) {
                local_1d8 = ZSTD_RowFindBestMatch_noDict_6_4
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
              else if (local_3d0 == 5) {
                local_1d8 = ZSTD_RowFindBestMatch_noDict_6_5
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
              else {
                local_1d8 = ZSTD_RowFindBestMatch_noDict_6_6
                                      ((ZSTD_matchState_t *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                         in_stack_fffffffffffff898),
                                       (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                        in_stack_fffffffffffff890),
                                       (size_t *)
                                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      );
              }
            }
          }
          else {
LAB_00913bf3:
            if (local_384 == 1) {
              if (local_37c == 0) {
                if (local_3cc == 4) {
                  local_1d8 = ZSTD_HcFindBestMatch_extDict_4
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff85c,
                                                  in_stack_fffffffffffff858),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                          in_stack_fffffffffffff850),
                                         in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                }
                else if (local_3cc == 5) {
                  local_1d8 = ZSTD_HcFindBestMatch_extDict_5
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff85c,
                                                  in_stack_fffffffffffff858),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                          in_stack_fffffffffffff850),
                                         in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                }
                else {
                  if (local_3cc != 6) goto LAB_00914039;
                  local_1d8 = ZSTD_HcFindBestMatch_extDict_6
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff85c,
                                                  in_stack_fffffffffffff858),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                          in_stack_fffffffffffff850),
                                         in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                }
              }
              else if (local_37c == 1) {
                if (local_3cc == 4) {
                  local_1d8 = ZSTD_BtFindBestMatch_extDict_4
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff7f4,
                                                  in_stack_fffffffffffff7f0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                          in_stack_fffffffffffff7e8),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                          in_stack_fffffffffffff7e0),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff7dc,
                                                  in_stack_fffffffffffff7d8));
                }
                else if (local_3cc == 5) {
                  local_1d8 = ZSTD_BtFindBestMatch_extDict_5
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff7f4,
                                                  in_stack_fffffffffffff7f0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                          in_stack_fffffffffffff7e8),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                          in_stack_fffffffffffff7e0),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff7dc,
                                                  in_stack_fffffffffffff7d8));
                }
                else {
                  if (local_3cc != 6) goto LAB_00914039;
                  local_1d8 = ZSTD_BtFindBestMatch_extDict_6
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff7f4,
                                                  in_stack_fffffffffffff7f0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                          in_stack_fffffffffffff7e8),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                          in_stack_fffffffffffff7e0),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff7dc,
                                                  in_stack_fffffffffffff7d8));
                }
              }
              else if (local_3cc == 4) {
                if (local_3d0 == 4) {
                  local_1d8 = ZSTD_RowFindBestMatch_extDict_4_4
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
                else if (local_3d0 == 5) {
                  local_1d8 = ZSTD_RowFindBestMatch_extDict_4_5
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
                else {
                  local_1d8 = ZSTD_RowFindBestMatch_extDict_4_6
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
              }
              else if (local_3cc == 5) {
                if (local_3d0 == 4) {
                  local_1d8 = ZSTD_RowFindBestMatch_extDict_5_4
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
                else if (local_3d0 == 5) {
                  local_1d8 = ZSTD_RowFindBestMatch_extDict_5_5
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
                else {
                  local_1d8 = ZSTD_RowFindBestMatch_extDict_5_6
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
              }
              else {
                if (local_3cc != 6) goto LAB_00914039;
                if (local_3d0 == 4) {
                  local_1d8 = ZSTD_RowFindBestMatch_extDict_6_4
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
                else if (local_3d0 == 5) {
                  local_1d8 = ZSTD_RowFindBestMatch_extDict_6_5
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
                else {
                  local_1d8 = ZSTD_RowFindBestMatch_extDict_6_6
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
              }
            }
            else {
LAB_00914039:
              if (local_384 == 2) {
                if (local_37c == 0) {
                  if (local_3cc == 4) {
                    local_1d8 = ZSTD_HcFindBestMatch_dictMatchState_4
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff85c,
                                                    in_stack_fffffffffffff858),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                            in_stack_fffffffffffff850),
                                           in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                  }
                  else if (local_3cc == 5) {
                    local_1d8 = ZSTD_HcFindBestMatch_dictMatchState_5
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff85c,
                                                    in_stack_fffffffffffff858),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                            in_stack_fffffffffffff850),
                                           in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                  }
                  else {
                    if (local_3cc != 6) goto LAB_0091447f;
                    local_1d8 = ZSTD_HcFindBestMatch_dictMatchState_6
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff85c,
                                                    in_stack_fffffffffffff858),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                            in_stack_fffffffffffff850),
                                           in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                  }
                }
                else if (local_37c == 1) {
                  if (local_3cc == 4) {
                    local_1d8 = ZSTD_BtFindBestMatch_dictMatchState_4
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff7f4,
                                                    in_stack_fffffffffffff7f0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                            in_stack_fffffffffffff7e8),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                            in_stack_fffffffffffff7e0),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff7dc,
                                                    in_stack_fffffffffffff7d8));
                  }
                  else if (local_3cc == 5) {
                    local_1d8 = ZSTD_BtFindBestMatch_dictMatchState_5
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff7f4,
                                                    in_stack_fffffffffffff7f0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                            in_stack_fffffffffffff7e8),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                            in_stack_fffffffffffff7e0),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff7dc,
                                                    in_stack_fffffffffffff7d8));
                  }
                  else {
                    if (local_3cc != 6) goto LAB_0091447f;
                    local_1d8 = ZSTD_BtFindBestMatch_dictMatchState_6
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff7f4,
                                                    in_stack_fffffffffffff7f0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                            in_stack_fffffffffffff7e8),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                            in_stack_fffffffffffff7e0),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff7dc,
                                                    in_stack_fffffffffffff7d8));
                  }
                }
                else if (local_3cc == 4) {
                  if (local_3d0 == 4) {
                    local_1d8 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff8a4,
                                                    in_stack_fffffffffffff8a0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                            in_stack_fffffffffffff898),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                            in_stack_fffffffffffff890),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff88c,
                                                    in_stack_fffffffffffff888));
                  }
                  else if (local_3d0 == 5) {
                    local_1d8 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff8a4,
                                                    in_stack_fffffffffffff8a0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                            in_stack_fffffffffffff898),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                            in_stack_fffffffffffff890),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff88c,
                                                    in_stack_fffffffffffff888));
                  }
                  else {
                    local_1d8 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff8a4,
                                                    in_stack_fffffffffffff8a0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                            in_stack_fffffffffffff898),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                            in_stack_fffffffffffff890),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff88c,
                                                    in_stack_fffffffffffff888));
                  }
                }
                else if (local_3cc == 5) {
                  if (local_3d0 == 4) {
                    local_1d8 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff8a4,
                                                    in_stack_fffffffffffff8a0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                            in_stack_fffffffffffff898),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                            in_stack_fffffffffffff890),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff88c,
                                                    in_stack_fffffffffffff888));
                  }
                  else if (local_3d0 == 5) {
                    local_1d8 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff8a4,
                                                    in_stack_fffffffffffff8a0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                            in_stack_fffffffffffff898),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                            in_stack_fffffffffffff890),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff88c,
                                                    in_stack_fffffffffffff888));
                  }
                  else {
                    local_1d8 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff8a4,
                                                    in_stack_fffffffffffff8a0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                            in_stack_fffffffffffff898),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                            in_stack_fffffffffffff890),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff88c,
                                                    in_stack_fffffffffffff888));
                  }
                }
                else {
                  if (local_3cc != 6) goto LAB_0091447f;
                  if (local_3d0 == 4) {
                    local_1d8 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff8a4,
                                                    in_stack_fffffffffffff8a0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                            in_stack_fffffffffffff898),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                            in_stack_fffffffffffff890),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff88c,
                                                    in_stack_fffffffffffff888));
                  }
                  else if (local_3d0 == 5) {
                    local_1d8 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff8a4,
                                                    in_stack_fffffffffffff8a0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                            in_stack_fffffffffffff898),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                            in_stack_fffffffffffff890),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff88c,
                                                    in_stack_fffffffffffff888));
                  }
                  else {
                    local_1d8 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff8a4,
                                                    in_stack_fffffffffffff8a0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                            in_stack_fffffffffffff898),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                            in_stack_fffffffffffff890),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff88c,
                                                    in_stack_fffffffffffff888));
                  }
                }
              }
              else {
LAB_0091447f:
                if (local_384 == 3) {
                  if (local_37c == 0) {
                    if (local_3cc == 4) {
                      local_1d8 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff85c,
                                                      in_stack_fffffffffffff858),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                              in_stack_fffffffffffff850),
                                             in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                    }
                    else if (local_3cc == 5) {
                      local_1d8 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff85c,
                                                      in_stack_fffffffffffff858),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                              in_stack_fffffffffffff850),
                                             in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                    }
                    else if (local_3cc == 6) {
                      local_1d8 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff85c,
                                                      in_stack_fffffffffffff858),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                              in_stack_fffffffffffff850),
                                             in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                    }
                  }
                  else if (local_37c == 1) {
                    if (local_3cc == 4) {
                      local_1d8 = ZSTD_BtFindBestMatch_dedicatedDictSearch_4
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff7f4,
                                                      in_stack_fffffffffffff7f0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                              in_stack_fffffffffffff7e8),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                              in_stack_fffffffffffff7e0),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff7dc,
                                                      in_stack_fffffffffffff7d8));
                    }
                    else if (local_3cc == 5) {
                      local_1d8 = ZSTD_BtFindBestMatch_dedicatedDictSearch_5
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff7f4,
                                                      in_stack_fffffffffffff7f0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                              in_stack_fffffffffffff7e8),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                              in_stack_fffffffffffff7e0),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff7dc,
                                                      in_stack_fffffffffffff7d8));
                    }
                    else if (local_3cc == 6) {
                      local_1d8 = ZSTD_BtFindBestMatch_dedicatedDictSearch_6
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff7f4,
                                                      in_stack_fffffffffffff7f0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                              in_stack_fffffffffffff7e8),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                              in_stack_fffffffffffff7e0),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff7dc,
                                                      in_stack_fffffffffffff7d8));
                    }
                  }
                  else if (local_3cc == 4) {
                    if (local_3d0 == 4) {
                      local_1d8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else if (local_3d0 == 5) {
                      local_1d8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else {
                      local_1d8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                  }
                  else if (local_3cc == 5) {
                    if (local_3d0 == 4) {
                      local_1d8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else if (local_3d0 == 5) {
                      local_1d8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else {
                      local_1d8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                  }
                  else if (local_3cc == 6) {
                    if (local_3d0 == 4) {
                      local_1d8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else if (local_3d0 == 5) {
                      local_1d8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else {
                      local_1d8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                  }
                }
              }
            }
          }
          local_4c0 = local_1d8;
          lVar8 = local_1d8 << 2;
          uVar6 = ZSTD_highbit32(0);
          local_4c4 = (int)lVar8 - uVar6;
          lVar8 = local_438 << 2;
          uVar6 = ZSTD_highbit32(0);
          local_4c8 = ((int)lVar8 - uVar6) + 4;
          if ((local_4c0 < 4) || (local_4c4 <= local_4c8)) {
            if ((local_380 != 2) || (local_3b0 <= local_398)) break;
            local_398 = local_398 + 1;
            if ((local_384 == 0) && (local_440 != 0)) {
              bVar9 = local_3d4 != 0;
              UVar3 = MEM_read32(local_398);
              UVar4 = MEM_read32(local_398 + -(ulong)local_3d4);
              if (bVar9 && UVar3 == UVar4) {
                sVar7 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffff81c,local_7e0),
                                   in_stack_fffffffffffff810,in_stack_fffffffffffff808);
                local_4d0 = sVar7 + 4;
                local_4d4 = (int)local_4d0 * 4;
                lVar8 = local_438 << 2;
                uVar6 = ZSTD_highbit32(0);
                local_4d8 = ((int)lVar8 - uVar6) + 1;
                if ((3 < local_4d0) && (local_4d8 < local_4d4)) {
                  local_438 = local_4d0;
                  local_440 = 1;
                  local_448 = local_398;
                }
              }
            }
            if (local_3ec != 0) {
              local_4dc = ((int)local_398 - (int)local_3b8) - local_3d4;
              if (local_4dc < local_3bc) {
                local_728 = (void *)(local_408 + (ulong)(local_4dc - local_41c));
              }
              else {
                local_728 = (void *)(local_3b8 + (ulong)local_4dc);
              }
              local_4e8 = local_728;
              if (2 < (local_3bc - 1) - local_4dc) {
                UVar3 = MEM_read32(local_728);
                UVar4 = MEM_read32(local_398);
                if (UVar3 == UVar4) {
                  if (local_4dc < local_3bc) {
                    local_738 = local_418;
                  }
                  else {
                    local_738 = local_3a8;
                  }
                  local_4f0 = local_738;
                  sVar7 = ZSTD_count_2segments
                                    ((BYTE *)CONCAT44(in_stack_fffffffffffff81c,local_7e0),
                                     in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff804,
                                                      in_stack_fffffffffffff800),
                                     in_stack_fffffffffffff7f8);
                  local_4f8 = sVar7 + 4;
                  local_4fc = (int)local_4f8 * 4;
                  lVar8 = local_438 << 2;
                  uVar6 = ZSTD_highbit32(0);
                  local_500 = ((int)lVar8 - uVar6) + 1;
                  if ((3 < local_4f8) && (local_500 < local_4fc)) {
                    local_438 = local_4f8;
                    local_440 = 1;
                    local_448 = local_398;
                  }
                }
              }
            }
            local_508 = 999999999;
            local_218 = local_358;
            local_220 = local_398;
            local_228 = local_3a8;
            local_230 = &local_508;
            local_234 = local_3cc;
            local_238 = local_3d0;
            local_23c = local_37c;
            local_240 = local_384;
            if (local_384 == 0) {
              if (local_37c == 0) {
                if (local_3cc == 4) {
                  local_210 = ZSTD_HcFindBestMatch_noDict_4
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff85c,
                                                  in_stack_fffffffffffff858),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                          in_stack_fffffffffffff850),
                                         in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                }
                else if (local_3cc == 5) {
                  local_210 = ZSTD_HcFindBestMatch_noDict_5
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff85c,
                                                  in_stack_fffffffffffff858),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                          in_stack_fffffffffffff850),
                                         in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                }
                else {
                  if (local_3cc != 6) goto LAB_009151f3;
                  local_210 = ZSTD_HcFindBestMatch_noDict_6
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff85c,
                                                  in_stack_fffffffffffff858),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                          in_stack_fffffffffffff850),
                                         in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                }
              }
              else if (local_37c == 1) {
                if (local_3cc == 4) {
                  local_210 = ZSTD_BtFindBestMatch_noDict_4
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff7f4,
                                                  in_stack_fffffffffffff7f0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                          in_stack_fffffffffffff7e8),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                          in_stack_fffffffffffff7e0),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff7dc,
                                                  in_stack_fffffffffffff7d8));
                }
                else if (local_3cc == 5) {
                  local_210 = ZSTD_BtFindBestMatch_noDict_5
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff7f4,
                                                  in_stack_fffffffffffff7f0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                          in_stack_fffffffffffff7e8),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                          in_stack_fffffffffffff7e0),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff7dc,
                                                  in_stack_fffffffffffff7d8));
                }
                else {
                  if (local_3cc != 6) goto LAB_009151f3;
                  local_210 = ZSTD_BtFindBestMatch_noDict_6
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff7f4,
                                                  in_stack_fffffffffffff7f0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                          in_stack_fffffffffffff7e8),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                          in_stack_fffffffffffff7e0),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff7dc,
                                                  in_stack_fffffffffffff7d8));
                }
              }
              else if (local_3cc == 4) {
                if (local_3d0 == 4) {
                  local_210 = ZSTD_RowFindBestMatch_noDict_4_4
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
                else if (local_3d0 == 5) {
                  local_210 = ZSTD_RowFindBestMatch_noDict_4_5
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
                else {
                  local_210 = ZSTD_RowFindBestMatch_noDict_4_6
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
              }
              else if (local_3cc == 5) {
                if (local_3d0 == 4) {
                  local_210 = ZSTD_RowFindBestMatch_noDict_5_4
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
                else if (local_3d0 == 5) {
                  local_210 = ZSTD_RowFindBestMatch_noDict_5_5
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
                else {
                  local_210 = ZSTD_RowFindBestMatch_noDict_5_6
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
              }
              else {
                if (local_3cc != 6) goto LAB_009151f3;
                in_stack_fffffffffffff8a4 = local_3d0;
                if (local_3d0 == 4) {
                  local_210 = ZSTD_RowFindBestMatch_noDict_6_4
                                        ((ZSTD_matchState_t *)CONCAT44(4,in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
                else if (local_3d0 == 5) {
                  local_210 = ZSTD_RowFindBestMatch_noDict_6_5
                                        ((ZSTD_matchState_t *)CONCAT44(5,in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
                else {
                  local_210 = ZSTD_RowFindBestMatch_noDict_6_6
                                        ((ZSTD_matchState_t *)
                                         CONCAT44(local_3d0,in_stack_fffffffffffff8a0),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                          in_stack_fffffffffffff898),
                                         (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                          in_stack_fffffffffffff890),
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff88c,
                                                  in_stack_fffffffffffff888));
                }
              }
            }
            else {
LAB_009151f3:
              if (local_384 == 1) {
                in_stack_fffffffffffff8a0 = local_37c;
                if (local_37c == 0) {
                  in_stack_fffffffffffff89c = local_3cc;
                  if (local_3cc == 4) {
                    local_210 = ZSTD_HcFindBestMatch_extDict_4
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff85c,
                                                    in_stack_fffffffffffff858),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                            in_stack_fffffffffffff850),
                                           in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                  }
                  else if (local_3cc == 5) {
                    local_210 = ZSTD_HcFindBestMatch_extDict_5
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff85c,
                                                    in_stack_fffffffffffff858),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                            in_stack_fffffffffffff850),
                                           in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                  }
                  else {
                    if (local_3cc != 6) goto LAB_00915639;
                    local_210 = ZSTD_HcFindBestMatch_extDict_6
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff85c,
                                                    in_stack_fffffffffffff858),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                            in_stack_fffffffffffff850),
                                           in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                  }
                }
                else if (local_37c == 1) {
                  in_stack_fffffffffffff898 = local_3cc;
                  if (local_3cc == 4) {
                    local_210 = ZSTD_BtFindBestMatch_extDict_4
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff7f4,
                                                    in_stack_fffffffffffff7f0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                            in_stack_fffffffffffff7e8),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                            in_stack_fffffffffffff7e0),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff7dc,
                                                    in_stack_fffffffffffff7d8));
                  }
                  else if (local_3cc == 5) {
                    local_210 = ZSTD_BtFindBestMatch_extDict_5
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff7f4,
                                                    in_stack_fffffffffffff7f0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                            in_stack_fffffffffffff7e8),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                            in_stack_fffffffffffff7e0),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff7dc,
                                                    in_stack_fffffffffffff7d8));
                  }
                  else {
                    if (local_3cc != 6) goto LAB_00915639;
                    local_210 = ZSTD_BtFindBestMatch_extDict_6
                                          ((ZSTD_matchState_t *)
                                           CONCAT44(in_stack_fffffffffffff7f4,
                                                    in_stack_fffffffffffff7f0),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                            in_stack_fffffffffffff7e8),
                                           (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                            in_stack_fffffffffffff7e0),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff7dc,
                                                    in_stack_fffffffffffff7d8));
                  }
                }
                else {
                  in_stack_fffffffffffff894 = local_3cc;
                  if (local_3cc == 4) {
                    in_stack_fffffffffffff890 = local_3d0;
                    if (local_3d0 == 4) {
                      local_210 = ZSTD_RowFindBestMatch_extDict_4_4
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,local_37c),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)0x400000004,
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else if (local_3d0 == 5) {
                      local_210 = ZSTD_RowFindBestMatch_extDict_4_5
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,local_37c),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)0x400000005,
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else {
                      local_210 = ZSTD_RowFindBestMatch_extDict_4_6
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,local_37c),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(4,local_3d0),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                  }
                  else if (local_3cc == 5) {
                    in_stack_fffffffffffff88c = local_3d0;
                    if (local_3d0 == 4) {
                      local_210 = ZSTD_RowFindBestMatch_extDict_5_4
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,local_37c),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(5,in_stack_fffffffffffff890),
                                             (size_t *)CONCAT44(4,in_stack_fffffffffffff888));
                    }
                    else if (local_3d0 == 5) {
                      local_210 = ZSTD_RowFindBestMatch_extDict_5_5
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,local_37c),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(5,in_stack_fffffffffffff890),
                                             (size_t *)CONCAT44(5,in_stack_fffffffffffff888));
                    }
                    else {
                      local_210 = ZSTD_RowFindBestMatch_extDict_5_6
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,local_37c),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(5,in_stack_fffffffffffff890),
                                             (size_t *)CONCAT44(local_3d0,in_stack_fffffffffffff888)
                                            );
                    }
                  }
                  else {
                    if (local_3cc != 6) goto LAB_00915639;
                    in_stack_fffffffffffff888 = local_3d0;
                    if (local_3d0 == 4) {
                      local_210 = ZSTD_RowFindBestMatch_extDict_6_4
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,local_37c),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(6,in_stack_fffffffffffff890),
                                             (size_t *)CONCAT44(in_stack_fffffffffffff88c,4));
                    }
                    else if (local_3d0 == 5) {
                      local_210 = ZSTD_RowFindBestMatch_extDict_6_5
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,local_37c),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(6,in_stack_fffffffffffff890),
                                             (size_t *)CONCAT44(in_stack_fffffffffffff88c,5));
                    }
                    else {
                      local_210 = ZSTD_RowFindBestMatch_extDict_6_6
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,local_37c),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(6,in_stack_fffffffffffff890),
                                             (size_t *)CONCAT44(in_stack_fffffffffffff88c,local_3d0)
                                            );
                    }
                  }
                }
              }
              else {
LAB_00915639:
                if (local_384 == 2) {
                  if (local_37c == 0) {
                    if (local_3cc == 4) {
                      local_210 = ZSTD_HcFindBestMatch_dictMatchState_4
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff85c,
                                                      in_stack_fffffffffffff858),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                              in_stack_fffffffffffff850),
                                             in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                    }
                    else if (local_3cc == 5) {
                      local_210 = ZSTD_HcFindBestMatch_dictMatchState_5
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff85c,
                                                      in_stack_fffffffffffff858),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                              in_stack_fffffffffffff850),
                                             in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                    }
                    else {
                      if (local_3cc != 6) goto LAB_00915a7f;
                      local_210 = ZSTD_HcFindBestMatch_dictMatchState_6
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff85c,
                                                      in_stack_fffffffffffff858),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                              in_stack_fffffffffffff850),
                                             in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                    }
                  }
                  else if (local_37c == 1) {
                    if (local_3cc == 4) {
                      local_210 = ZSTD_BtFindBestMatch_dictMatchState_4
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff7f4,
                                                      in_stack_fffffffffffff7f0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                              in_stack_fffffffffffff7e8),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                              in_stack_fffffffffffff7e0),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff7dc,
                                                      in_stack_fffffffffffff7d8));
                    }
                    else if (local_3cc == 5) {
                      local_210 = ZSTD_BtFindBestMatch_dictMatchState_5
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff7f4,
                                                      in_stack_fffffffffffff7f0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                              in_stack_fffffffffffff7e8),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                              in_stack_fffffffffffff7e0),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff7dc,
                                                      in_stack_fffffffffffff7d8));
                    }
                    else {
                      if (local_3cc != 6) goto LAB_00915a7f;
                      local_210 = ZSTD_BtFindBestMatch_dictMatchState_6
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff7f4,
                                                      in_stack_fffffffffffff7f0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                              in_stack_fffffffffffff7e8),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                              in_stack_fffffffffffff7e0),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff7dc,
                                                      in_stack_fffffffffffff7d8));
                    }
                  }
                  else if (local_3cc == 4) {
                    if (local_3d0 == 4) {
                      local_210 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else if (local_3d0 == 5) {
                      local_210 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else {
                      local_210 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                  }
                  else if (local_3cc == 5) {
                    if (local_3d0 == 4) {
                      local_210 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else if (local_3d0 == 5) {
                      local_210 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else {
                      local_210 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                  }
                  else {
                    if (local_3cc != 6) goto LAB_00915a7f;
                    if (local_3d0 == 4) {
                      local_210 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else if (local_3d0 == 5) {
                      local_210 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                    else {
                      local_210 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                                            ((ZSTD_matchState_t *)
                                             CONCAT44(in_stack_fffffffffffff8a4,
                                                      in_stack_fffffffffffff8a0),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                              in_stack_fffffffffffff898),
                                             (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                              in_stack_fffffffffffff890),
                                             (size_t *)
                                             CONCAT44(in_stack_fffffffffffff88c,
                                                      in_stack_fffffffffffff888));
                    }
                  }
                }
                else {
LAB_00915a7f:
                  if (local_384 == 3) {
                    if (local_37c == 0) {
                      if (local_3cc == 4) {
                        local_210 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                                              ((ZSTD_matchState_t *)
                                               CONCAT44(in_stack_fffffffffffff85c,
                                                        in_stack_fffffffffffff858),
                                               (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                                in_stack_fffffffffffff850),
                                               in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                      }
                      else if (local_3cc == 5) {
                        local_210 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                                              ((ZSTD_matchState_t *)
                                               CONCAT44(in_stack_fffffffffffff85c,
                                                        in_stack_fffffffffffff858),
                                               (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                                in_stack_fffffffffffff850),
                                               in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                      }
                      else if (local_3cc == 6) {
                        local_210 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                                              ((ZSTD_matchState_t *)
                                               CONCAT44(in_stack_fffffffffffff85c,
                                                        in_stack_fffffffffffff858),
                                               (BYTE *)CONCAT44(in_stack_fffffffffffff854,
                                                                in_stack_fffffffffffff850),
                                               in_stack_fffffffffffff848,in_stack_fffffffffffff840);
                      }
                    }
                    else if (local_37c == 1) {
                      if (local_3cc == 4) {
                        local_210 = ZSTD_BtFindBestMatch_dedicatedDictSearch_4
                                              ((ZSTD_matchState_t *)
                                               CONCAT44(in_stack_fffffffffffff7f4,
                                                        in_stack_fffffffffffff7f0),
                                               (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                                in_stack_fffffffffffff7e8),
                                               (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                                in_stack_fffffffffffff7e0),
                                               (size_t *)
                                               CONCAT44(in_stack_fffffffffffff7dc,
                                                        in_stack_fffffffffffff7d8));
                      }
                      else if (local_3cc == 5) {
                        local_210 = ZSTD_BtFindBestMatch_dedicatedDictSearch_5
                                              ((ZSTD_matchState_t *)
                                               CONCAT44(in_stack_fffffffffffff7f4,
                                                        in_stack_fffffffffffff7f0),
                                               (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                                in_stack_fffffffffffff7e8),
                                               (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                                in_stack_fffffffffffff7e0),
                                               (size_t *)
                                               CONCAT44(in_stack_fffffffffffff7dc,
                                                        in_stack_fffffffffffff7d8));
                      }
                      else if (local_3cc == 6) {
                        local_210 = ZSTD_BtFindBestMatch_dedicatedDictSearch_6
                                              ((ZSTD_matchState_t *)
                                               CONCAT44(in_stack_fffffffffffff7f4,
                                                        in_stack_fffffffffffff7f0),
                                               (BYTE *)CONCAT44(in_stack_fffffffffffff7ec,
                                                                in_stack_fffffffffffff7e8),
                                               (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                                in_stack_fffffffffffff7e0),
                                               (size_t *)
                                               CONCAT44(in_stack_fffffffffffff7dc,
                                                        in_stack_fffffffffffff7d8));
                      }
                    }
                    else {
                      in_stack_fffffffffffff85c = local_3cc;
                      if (local_3cc == 4) {
                        in_stack_fffffffffffff858 = local_3d0;
                        if (local_3d0 == 4) {
                          local_210 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                                ((ZSTD_matchState_t *)
                                                 CONCAT44(in_stack_fffffffffffff8a4,
                                                          in_stack_fffffffffffff8a0),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                                  in_stack_fffffffffffff898),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                                  in_stack_fffffffffffff890),
                                                 (size_t *)
                                                 CONCAT44(in_stack_fffffffffffff88c,
                                                          in_stack_fffffffffffff888));
                        }
                        else if (local_3d0 == 5) {
                          local_210 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                                ((ZSTD_matchState_t *)
                                                 CONCAT44(in_stack_fffffffffffff8a4,
                                                          in_stack_fffffffffffff8a0),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                                  in_stack_fffffffffffff898),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                                  in_stack_fffffffffffff890),
                                                 (size_t *)
                                                 CONCAT44(in_stack_fffffffffffff88c,
                                                          in_stack_fffffffffffff888));
                        }
                        else {
                          local_210 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                                ((ZSTD_matchState_t *)
                                                 CONCAT44(in_stack_fffffffffffff8a4,
                                                          in_stack_fffffffffffff8a0),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                                  in_stack_fffffffffffff898),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                                  in_stack_fffffffffffff890),
                                                 (size_t *)
                                                 CONCAT44(in_stack_fffffffffffff88c,
                                                          in_stack_fffffffffffff888));
                        }
                      }
                      else if (local_3cc == 5) {
                        in_stack_fffffffffffff854 = local_3d0;
                        if (local_3d0 == 4) {
                          local_210 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                                ((ZSTD_matchState_t *)
                                                 CONCAT44(in_stack_fffffffffffff8a4,
                                                          in_stack_fffffffffffff8a0),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                                  in_stack_fffffffffffff898),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                                  in_stack_fffffffffffff890),
                                                 (size_t *)
                                                 CONCAT44(in_stack_fffffffffffff88c,
                                                          in_stack_fffffffffffff888));
                        }
                        else if (local_3d0 == 5) {
                          local_210 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                                ((ZSTD_matchState_t *)
                                                 CONCAT44(in_stack_fffffffffffff8a4,
                                                          in_stack_fffffffffffff8a0),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                                  in_stack_fffffffffffff898),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                                  in_stack_fffffffffffff890),
                                                 (size_t *)
                                                 CONCAT44(in_stack_fffffffffffff88c,
                                                          in_stack_fffffffffffff888));
                        }
                        else {
                          local_210 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                                ((ZSTD_matchState_t *)
                                                 CONCAT44(in_stack_fffffffffffff8a4,
                                                          in_stack_fffffffffffff8a0),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                                  in_stack_fffffffffffff898),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                                  in_stack_fffffffffffff890),
                                                 (size_t *)
                                                 CONCAT44(in_stack_fffffffffffff88c,
                                                          in_stack_fffffffffffff888));
                        }
                      }
                      else if (local_3cc == 6) {
                        in_stack_fffffffffffff850 = local_3d0;
                        if (local_3d0 == 4) {
                          local_210 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                                ((ZSTD_matchState_t *)
                                                 CONCAT44(in_stack_fffffffffffff8a4,
                                                          in_stack_fffffffffffff8a0),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                                  in_stack_fffffffffffff898),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                                  in_stack_fffffffffffff890),
                                                 (size_t *)
                                                 CONCAT44(in_stack_fffffffffffff88c,
                                                          in_stack_fffffffffffff888));
                        }
                        else if (local_3d0 == 5) {
                          local_210 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                                ((ZSTD_matchState_t *)
                                                 CONCAT44(in_stack_fffffffffffff8a4,
                                                          in_stack_fffffffffffff8a0),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                                  in_stack_fffffffffffff898),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                                  in_stack_fffffffffffff890),
                                                 (size_t *)
                                                 CONCAT44(in_stack_fffffffffffff88c,
                                                          in_stack_fffffffffffff888));
                        }
                        else {
                          local_210 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                                ((ZSTD_matchState_t *)
                                                 CONCAT44(in_stack_fffffffffffff8a4,
                                                          in_stack_fffffffffffff8a0),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff89c,
                                                                  in_stack_fffffffffffff898),
                                                 (BYTE *)CONCAT44(in_stack_fffffffffffff894,
                                                                  in_stack_fffffffffffff890),
                                                 (size_t *)
                                                 CONCAT44(in_stack_fffffffffffff88c,
                                                          in_stack_fffffffffffff888));
                        }
                      }
                    }
                  }
                }
              }
            }
            uVar2 = local_210;
            in_stack_fffffffffffff840 = (size_t *)(local_210 << 2);
            uVar6 = ZSTD_highbit32(0);
            iVar1 = (int)in_stack_fffffffffffff840;
            in_stack_fffffffffffff848 = (BYTE *)(local_438 << 2);
            uVar5 = ZSTD_highbit32(0);
            if ((uVar2 < 4) ||
               ((int)(iVar1 - uVar6) <= (int)(((int)in_stack_fffffffffffff848 - uVar5) + 7))) break;
            local_438 = uVar2;
            local_440 = local_508;
            local_448 = local_398;
          }
          else {
            local_438 = local_4c0;
            local_440 = local_4b8;
            local_448 = local_398;
          }
        }
      }
      if (3 < local_440) {
        if (local_384 == 0) {
          while( true ) {
            bVar9 = false;
            if (local_3a0 < local_448 && local_3c8 < (long)local_448 - (local_440 - 3)) {
              bVar9 = local_448[-1] == local_448[-1 - (local_440 - 3)];
            }
            if (!bVar9) break;
            local_448 = local_448 + -1;
            local_438 = local_438 + 1;
          }
        }
        if (local_3ec != 0) {
          uVar6 = ((int)local_448 - (int)local_3b8) - ((int)local_440 + -3);
          if (uVar6 < local_3bc) {
            local_7d0 = (local_408 + (ulong)uVar6) - (ulong)local_41c;
          }
          else {
            local_7d0 = local_3b8 + (ulong)uVar6;
          }
          local_528 = local_7d0;
          if (uVar6 < local_3bc) {
            local_7d8 = local_410;
          }
          else {
            local_7d8 = local_3c8;
          }
          while( true ) {
            bVar9 = false;
            if ((local_3a0 < local_448) && (bVar9 = false, local_7d8 < local_528)) {
              bVar9 = local_448[-1] == *(BYTE *)(local_528 - 1);
            }
            if (!bVar9) break;
            local_448 = local_448 + -1;
            local_528 = local_528 - 1;
            local_438 = local_438 + 1;
          }
        }
        local_3d8 = local_3d4;
        local_3d4 = (int)local_440 - 3;
      }
      goto LAB_009161eb;
    }
    local_478 = ((ulong)((long)local_398 - (long)local_3a0) >> 8) + 1;
    local_398 = local_398 + local_478;
    *(uint *)(local_358 + 300) = (uint)(8 < local_478);
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_dictMatchState_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2, ZSTD_dictMatchState);
}